

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetCodeGenerator.h
# Opt level: O0

void __thiscall
flow::TargetCodeGenerator::emitInstr(TargetCodeGenerator *this,Opcode opc,Operand op1)

{
  Instruction instr;
  Operand op1_local;
  Opcode opc_local;
  TargetCodeGenerator *this_local;
  
  instr = makeInstruction(opc,op1);
  emitInstr(this,instr);
  return;
}

Assistant:

void emitInstr(Opcode opc, Operand op1) {
    emitInstr(makeInstruction(opc, op1));
  }